

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorPool::FindAllExtensions
          (DescriptorPool *this,Descriptor *extendee,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *out)

{
  int number_00;
  DescriptorDatabase *pDVar1;
  bool bVar2;
  uint uVar3;
  pointer pTVar4;
  size_type sVar5;
  string *psVar6;
  reference piVar7;
  FieldDescriptor *pFVar8;
  iterator iStack_68;
  int number;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  vector<int,_std::allocator<int>_> numbers;
  MutexLockMaybe local_28;
  MutexLockMaybe lock;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *out_local;
  Descriptor *extendee_local;
  DescriptorPool *this_local;
  
  lock.mu_ = (Mutex *)out;
  out_local = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)extendee;
  extendee_local = (Descriptor *)this;
  internal::MutexLockMaybe::MutexLockMaybe(&local_28,this->mutex_);
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    pTVar4 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&pTVar4->known_bad_symbols_);
    pTVar4 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&pTVar4->known_bad_files_);
  }
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    pTVar4 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    sVar5 = std::
            unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ::count(&pTVar4->extensions_loaded_from_db_,(key_type *)&out_local);
    if (sVar5 == 0) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range4)
      ;
      pDVar1 = this->fallback_database_;
      psVar6 = Descriptor::full_name_abi_cxx11_((Descriptor *)out_local);
      uVar3 = (*pDVar1->_vptr_DescriptorDatabase[5])(pDVar1,psVar6,&__range4);
      if ((uVar3 & 1) != 0) {
        __end4 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)&__range4);
        iStack_68 = std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)&__range4);
        while (bVar2 = __gnu_cxx::operator!=(&__end4,&stack0xffffffffffffff98), bVar2) {
          piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end4);
          number_00 = *piVar7;
          pTVar4 = std::
                   unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   ::operator->(&this->tables_);
          pFVar8 = Tables::FindExtension(pTVar4,(Descriptor *)out_local,number_00);
          if (pFVar8 == (FieldDescriptor *)0x0) {
            TryFindExtensionInFallbackDatabase(this,(Descriptor *)out_local,number_00);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end4);
        }
        pTVar4 = std::
                 unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 ::operator->(&this->tables_);
        std::
        unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::insert(&pTVar4->extensions_loaded_from_db_,(value_type *)&out_local);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&__range4);
    }
  }
  pTVar4 = std::
           unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ::operator->(&this->tables_);
  Tables::FindAllExtensions
            (pTVar4,(Descriptor *)out_local,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)lock.mu_);
  if (this->underlay_ != (DescriptorPool *)0x0) {
    FindAllExtensions(this->underlay_,(Descriptor *)out_local,
                      (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)lock.mu_);
  }
  internal::MutexLockMaybe::~MutexLockMaybe(&local_28);
  return;
}

Assistant:

void DescriptorPool::FindAllExtensions(
    const Descriptor* extendee,
    std::vector<const FieldDescriptor*>* out) const {
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }

  // Initialize tables_->extensions_ from the fallback database first
  // (but do this only once per descriptor).
  if (fallback_database_ != nullptr &&
      tables_->extensions_loaded_from_db_.count(extendee) == 0) {
    std::vector<int> numbers;
    if (fallback_database_->FindAllExtensionNumbers(extendee->full_name(),
                                                    &numbers)) {
      for (int number : numbers) {
        if (tables_->FindExtension(extendee, number) == nullptr) {
          TryFindExtensionInFallbackDatabase(extendee, number);
        }
      }
      tables_->extensions_loaded_from_db_.insert(extendee);
    }
  }

  tables_->FindAllExtensions(extendee, out);
  if (underlay_ != nullptr) {
    underlay_->FindAllExtensions(extendee, out);
  }
}